

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_getenv(lua_State *L)

{
  char *__name;
  size_t *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  lua_State *in_stack_00000008;
  
  __name = luaL_checklstring(in_stack_00000008,unaff_retaddr_00,in_RDI);
  getenv(__name);
  lua_pushstring(in_stack_00000008,(char *)CONCAT44(unaff_retaddr_00,unaff_retaddr));
  return 1;
}

Assistant:

LJLIB_CF(os_getenv)
{
#if LJ_TARGET_CONSOLE
  lua_pushnil(L);
#else
  lua_pushstring(L, getenv(luaL_checkstring(L, 1)));  /* if NULL push nil */
#endif
  return 1;
}